

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# einsum.cpp
# Opt level: O0

int __thiscall ncnn::Einsum::load_param(Einsum *this,ParamDict *pd)

{
  FILE *pFVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  undefined8 uVar5;
  size_type sVar6;
  reference pvVar7;
  ulong uVar8;
  ParamDict *in_RSI;
  long in_RDI;
  size_t j;
  string *lhs_token;
  size_t i_2;
  size_t i_1;
  char *t;
  char *rhs;
  char *lhs;
  char *arrow;
  int i;
  int *p;
  char *equation_ptr;
  string equation;
  int equation_len;
  Mat equation_mat;
  value_type *in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  Mat *pMVar9;
  allocator<char> *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  ulong local_210;
  ulong local_200;
  ulong local_1f8;
  allocator<char> local_1e9;
  string local_1e8 [39];
  allocator<char> local_1c1;
  string local_1c0 [32];
  char *local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  char *local_190;
  char *local_188;
  undefined4 local_180;
  int local_17c;
  char *local_170;
  string local_168 [32];
  int local_148;
  Mat local_138;
  Mat local_f0;
  int local_94;
  Mat *local_90;
  Mat *local_88;
  Mat *local_78;
  Mat *local_68;
  int local_50;
  undefined4 local_4c;
  Mat *local_48;
  int local_30;
  undefined4 local_2c;
  Mat *local_28;
  void *local_20;
  
  local_90 = &local_138;
  local_138.data = (void *)0x0;
  local_138.refcount = (int *)0x0;
  local_138.elemsize = 0;
  local_138.elempack = 0;
  local_138.allocator = (Allocator *)0x0;
  local_138.dims = 0;
  local_138.w = 0;
  local_138.h = 0;
  local_138.d = 0;
  local_138.c = 0;
  local_138.cstep = 0;
  ParamDict::get(&local_f0,in_RSI,0,local_90);
  local_88 = &local_138;
  local_28 = local_88;
  if (local_138.refcount != (int *)0x0) {
    local_2c = 0xffffffff;
    LOCK();
    local_30 = *local_138.refcount;
    *local_138.refcount = *local_138.refcount + -1;
    UNLOCK();
    if (local_30 == 1) {
      if (local_138.allocator == (Allocator *)0x0) {
        local_20 = local_138.data;
        if (local_138.data != (void *)0x0) {
          free(local_138.data);
        }
      }
      else {
        (*(local_138.allocator)->_vptr_Allocator[3])(local_138.allocator,local_138.data);
      }
    }
  }
  local_138.data = (void *)0x0;
  local_138.elemsize = 0;
  local_138.elempack = 0;
  local_138.dims = 0;
  local_138.w = 0;
  local_138.h = 0;
  local_138.d = 0;
  local_138.c = 0;
  local_138.cstep = 0;
  local_138.refcount = (int *)0x0;
  local_148 = local_f0.w;
  std::__cxx11::string::string(local_168);
  std::__cxx11::string::resize((ulong)local_168);
  local_170 = (char *)std::__cxx11::string::c_str();
  local_68 = &local_f0;
  for (local_17c = 0; local_17c < local_148; local_17c = local_17c + 1) {
    local_170[local_17c] = (char)*(undefined4 *)((long)local_f0.data + (long)local_17c * 4);
  }
  bVar2 = std::operator==(in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
  if (bVar2) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0xe8),"ii");
    local_94 = 0;
  }
  else {
    local_188 = strstr(local_170,"->");
    if (local_188 == (char *)0x0) {
      fprintf(_stderr,"invalid equation %s",local_170);
      fprintf(_stderr,"\n");
      local_94 = -1;
    }
    else {
      *local_188 = '\0';
      local_188[1] = '\0';
      local_190 = local_170;
      local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_188 + 2);
      local_1a0 = strtok(local_170,",");
      while (local_1a0 != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        std::__cxx11::string::~string(local_1c0);
        std::allocator<char>::~allocator(&local_1c1);
        local_1a0 = strtok((char *)0x0,",");
      }
      this_00 = local_198;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      std::__cxx11::string::operator=((string *)(in_RDI + 0xe8),local_1e8);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator(&local_1e9);
      local_1f8 = 0;
      while (uVar8 = local_1f8, uVar3 = std::__cxx11::string::size(), uVar8 < uVar3) {
        pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI + 0xe8);
        if ((*pcVar4 < 'i') ||
           (pcVar4 = (char *)std::__cxx11::string::operator[](in_RDI + 0xe8), 'l' < *pcVar4)) {
          pFVar1 = _stderr;
          uVar5 = std::__cxx11::string::c_str();
          fprintf(pFVar1,"invalid rhs_token %s",uVar5);
          fprintf(_stderr,"\n");
          local_94 = -1;
          goto LAB_01d9ae38;
        }
        local_1f8 = local_1f8 + 1;
      }
      for (local_200 = 0;
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(in_RDI + 0xd0)), local_200 < sVar6; local_200 = local_200 + 1) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(in_RDI + 0xd0),local_200);
        for (local_210 = 0; uVar8 = std::__cxx11::string::size(), local_210 < uVar8;
            local_210 = local_210 + 1) {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar7);
          if ((*pcVar4 < 'i') ||
             (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar7), 'x' < *pcVar4)) {
            pFVar1 = _stderr;
            uVar5 = std::__cxx11::string::c_str();
            fprintf(pFVar1,"invalid lhs_token %s",uVar5);
            fprintf(_stderr,"\n");
            local_94 = -1;
            goto LAB_01d9ae38;
          }
        }
      }
      local_94 = 0;
    }
  }
LAB_01d9ae38:
  local_180 = 1;
  std::__cxx11::string::~string(local_168);
  pMVar9 = &local_f0;
  if (local_f0.refcount != (int *)0x0) {
    local_4c = 0xffffffff;
    LOCK();
    local_50 = *local_f0.refcount;
    *local_f0.refcount = *local_f0.refcount + -1;
    UNLOCK();
    if (local_50 == 1) {
      local_78 = pMVar9;
      local_48 = pMVar9;
      if (local_f0.allocator == (Allocator *)0x0) {
        if (local_f0.data != (void *)0x0) {
          free(local_f0.data);
        }
      }
      else {
        (*(local_f0.allocator)->_vptr_Allocator[3])(local_f0.allocator,local_f0.data);
      }
    }
  }
  pMVar9->data = (void *)0x0;
  pMVar9->elemsize = 0;
  pMVar9->elempack = 0;
  pMVar9->dims = 0;
  pMVar9->w = 0;
  pMVar9->h = 0;
  pMVar9->d = 0;
  pMVar9->c = 0;
  pMVar9->cstep = 0;
  pMVar9->refcount = (int *)0x0;
  return local_94;
}

Assistant:

int Einsum::load_param(const ParamDict& pd)
{
    Mat equation_mat = pd.get(0, Mat());

    const int equation_len = equation_mat.w;

    // restore to lexical equation string
    std::string equation;
    equation.resize(equation_len);
    char* equation_ptr = (char*)equation.c_str();
    {
        const int* p = equation_mat;
        for (int i = 0; i < equation_len; i++)
        {
            equation_ptr[i] = p[i];
        }
    }

    if (equation == "ii")
    {
        // trace
        rhs_token = "ii";

        return 0;
    }

    // split into tokens
    char* arrow = strstr(equation_ptr, "->");
    if (!arrow)
    {
        NCNN_LOGE("invalid equation %s", equation_ptr);
        return -1;
    }

    arrow[0] = '\0';
    arrow[1] = '\0';

    char* lhs = equation_ptr;
    char* rhs = arrow + 2;

    {
        char* t = strtok(lhs, ",");
        while (t)
        {
            lhs_tokens.push_back(std::string(t));
            t = strtok(NULL, ",");
        }
    }

    rhs_token = std::string(rhs);

    // check token always in ijkl
    {
        for (size_t i = 0; i < rhs_token.size(); i++)
        {
            if (rhs_token[i] < 'i' || rhs_token[i] > 'l')
            {
                NCNN_LOGE("invalid rhs_token %s", rhs_token.c_str());
                return -1;
            }
        }

        for (size_t i = 0; i < lhs_tokens.size(); i++)
        {
            const std::string& lhs_token = lhs_tokens[i];
            for (size_t j = 0; j < lhs_token.size(); j++)
            {
                if (lhs_token[j] < 'i' || lhs_token[j] > 'x')
                {
                    NCNN_LOGE("invalid lhs_token %s", lhs_token.c_str());
                    return -1;
                }
            }
        }
    }

    return 0;
}